

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,ON_UUID *mapping_id)

{
  bool bVar1;
  ON_MappingRef *pOVar2;
  ON_MappingChannel *unaff_RBX;
  int iVar3;
  
  pOVar2 = MappingRef(this,plugin_id);
  if (pOVar2 != (ON_MappingRef *)0x0) {
    iVar3 = (pOVar2->m_mapping_channels).m_count;
    if (iVar3 < 1) {
      bVar1 = true;
    }
    else {
      unaff_RBX = (pOVar2->m_mapping_channels).m_a;
      do {
        bVar1 = ::operator==(mapping_id,&unaff_RBX->m_mapping_id);
        if (bVar1) break;
        unaff_RBX = unaff_RBX + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      bVar1 = !bVar1;
    }
    if (!bVar1) {
      return unaff_RBX;
    }
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  const ON_UUID& mapping_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_id == mc->m_mapping_id )
          return mc;
      }
    }
  }
  return 0;
}